

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_SCFS(TT_ExecContext exc,FT_Long *args)

{
  ulong uVar1;
  FT_F26Dot6 FVar2;
  FT_Vector *pFVar3;
  FT_Vector *pFVar4;
  FT_UShort L;
  FT_Long K;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  uVar1 = *args;
  if ((ushort)uVar1 < (exc->zp2).n_points) {
    FVar2 = (*exc->func_project)
                      (exc,(exc->zp2).cur[uVar1 & 0xffff].x,(exc->zp2).cur[uVar1 & 0xffff].y);
    (*exc->func_move)(exc,&exc->zp2,(ushort)uVar1,args[1] - FVar2);
    if ((exc->GS).gep2 == 0) {
      pFVar3 = (exc->zp2).org + (uVar1 & 0xffff);
      pFVar4 = (exc->zp2).cur + (uVar1 & 0xffff);
      pFVar3->x = pFVar4->x;
      pFVar3->y = pFVar4->y;
    }
  }
  else if (exc->pedantic_hinting != '\0') {
    exc->error = 0x86;
  }
  return;
}

Assistant:

static void
  Ins_SCFS( TT_ExecContext  exc,
            FT_Long*        args )
  {
    FT_Long    K;
    FT_UShort  L;


    L = (FT_UShort)args[0];

    if ( BOUNDS( L, exc->zp2.n_points ) )
    {
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Invalid_Reference );
      return;
    }

    K = FAST_PROJECT( &exc->zp2.cur[L] );

    exc->func_move( exc, &exc->zp2, L, SUB_LONG( args[1], K ) );

    /* UNDOCUMENTED!  The MS rasterizer does that with */
    /* twilight points (confirmed by Greg Hitchcock)   */
    if ( exc->GS.gep2 == 0 )
      exc->zp2.org[L] = exc->zp2.cur[L];
  }